

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_setgid_fails(void)

{
  __uid_t _Var1;
  int iVar2;
  passwd *ppVar3;
  uv_loop_t *puVar4;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  passwd *pw;
  uv_uid_t uid;
  int r;
  
  _Var1 = getuid();
  if (_Var1 == 0) {
    ppVar3 = getpwnam("nobody");
    if (ppVar3 == (passwd *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
              ,0x61b,"pw","!=","NULL",0,"!=",0);
      abort();
    }
    iVar2 = setgid(ppVar3->pw_gid);
    if ((long)iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
              ,0x61c,"setgid(pw->pw_gid)","==","0",(long)iVar2,"==",0);
      abort();
    }
    iVar2 = setuid(ppVar3->pw_uid);
    if ((long)iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
              ,0x61d,"setuid(pw->pw_uid)","==","0",(long)iVar2,"==",0);
      abort();
    }
  }
  init_process_options("spawn_helper1",fail_cb);
  options.flags = options.flags | 2;
  options.gid = 0;
  puVar4 = uv_default_loop();
  iVar2 = uv_spawn(puVar4,&process,&options);
  if ((long)iVar2 != -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x631,"r","==","UV_EPERM",(long)iVar2,"==",0xffffffffffffffff);
    abort();
  }
  puVar4 = uv_default_loop();
  iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
  if ((long)iVar2 == 0) {
    if ((long)close_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
              ,0x637,"close_cb_called","==","0",(long)close_cb_called,"==",0);
      abort();
    }
    puVar4 = uv_default_loop();
    close_loop(puVar4);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if ((long)iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x639,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar2);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,0x635,"r","==","0",(long)iVar2,"==",0);
  abort();
}

Assistant:

TEST_IMPL(spawn_setgid_fails) {
  int r;

  /* if root, become nobody. */
  /* On IBMi PASE, there is no nobody user. */
#ifndef __PASE__
  uv_uid_t uid = getuid();
  if (uid == 0) {
    struct passwd* pw;
    pw = getpwnam("nobody");
    ASSERT_NOT_NULL(pw);
    ASSERT_OK(setgid(pw->pw_gid));
    ASSERT_OK(setuid(pw->pw_uid));
  }
#endif  /* !__PASE__ */

  init_process_options("spawn_helper1", fail_cb);

  options.flags |= UV_PROCESS_SETGID;
  /* On IBMi PASE, there is no root user. User may grant 
   * root-like privileges, including setting gid to 0.
   */
#if defined(__MVS__) || defined(__PASE__)
  options.gid = -1;
#else
  options.gid = 0;
#endif

  r = uv_spawn(uv_default_loop(), &process, &options);
#if defined(__CYGWIN__) || defined(__MVS__)
  ASSERT_EQ(r, UV_EINVAL);
#else
  ASSERT_EQ(r, UV_EPERM);
#endif

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}